

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O2

string * __thiscall
backend::codegen::format_fn_end_label_abi_cxx11_
          (string *__return_storage_ptr__,codegen *this,string_view function_name)

{
  ostream *poVar1;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,".end_");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)function_name._M_len,(long)this);
  std::operator<<(poVar1,"$");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_fn_end_label(std::string_view function_name) {
  auto s = std::stringstream();
  s << ".end_" << function_name << "$";
  return s.str();
}